

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O3

void duckdb::ColumnDataCopy<unsigned_long>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  byte bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  unsigned_long *source_data_1;
  reference pvVar6;
  ColumnDataAllocator *this_01;
  data_ptr_t pdVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  ulong uVar10;
  long lVar11;
  ushort uVar12;
  long lVar13;
  VectorDataIndex prev_index;
  _Head_base<0UL,_unsigned_long_*,_false> __s;
  unsigned_long *result_data;
  idx_t local_c0;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_70;
  unsigned_long local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  long local_48;
  ulong local_40;
  unsigned_long local_38;
  
  if (copy_count != 0) {
    this = meta_data->segment;
    state = meta_data->state;
    prev_index.index = (meta_data->vector_data_index).index;
    local_c0 = offset;
    do {
      pvVar6 = vector<duckdb::VectorMetaData,_true>::operator[](&this->vector_data,prev_index.index)
      ;
      uVar8 = (ulong)(0x800 - pvVar6->count);
      uVar10 = copy_count;
      if (uVar8 < copy_count) {
        uVar10 = uVar8;
      }
      local_40 = copy_count;
      this_01 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
      pdVar7 = ColumnDataAllocator::GetDataPointer
                         (this_01,&state->current_chunk_state,pvVar6->block_id,pvVar6->offset);
      __s._M_head_impl = (unsigned_long *)(pdVar7 + 0x4000);
      local_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_60 = 0x800;
      uVar12 = pvVar6->count;
      if ((ulong)uVar12 == 0) {
        switchD_012e3010::default(__s._M_head_impl,0xff,0x100);
      }
      if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar8 != 0) {
          pdVar3 = source_data->data;
          psVar1 = source_data->sel->sel_vector;
          lVar11 = 0;
          do {
            if (psVar1 == (sel_t *)0x0) {
              uVar8 = local_c0 + lVar11;
            }
            else {
              uVar8 = (ulong)psVar1[local_c0 + lVar11];
            }
            *(undefined8 *)(pdVar7 + lVar11 * 8 + (ulong)uVar12 * 8) =
                 *(undefined8 *)(pdVar3 + uVar8 * 8);
            lVar11 = lVar11 + 1;
          } while (uVar10 + (uVar10 == 0) != lVar11);
        }
      }
      else if (uVar8 != 0) {
        lVar11 = local_c0 * 4;
        lVar13 = 0;
        local_48 = lVar11;
        do {
          psVar1 = source_data->sel->sel_vector;
          if (psVar1 == (sel_t *)0x0) {
            uVar8 = local_c0 + lVar13;
          }
          else {
            uVar8 = (ulong)*(uint *)((long)psVar1 + lVar13 * 4 + lVar11);
          }
          puVar2 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            uVar12 = pvVar6->count;
LAB_012c5432:
            *(undefined8 *)(pdVar7 + lVar13 * 8 + (ulong)uVar12 * 8) =
                 *(undefined8 *)(source_data->data + uVar8 * 8);
          }
          else {
            uVar12 = pvVar6->count;
            if ((puVar2[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) goto LAB_012c5432;
            if (__s._M_head_impl == (unsigned_long *)0x0) {
              local_38 = local_60;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_58,&local_38);
              p_Var5 = p_Stack_50;
              local_70.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = local_58;
              this_00._M_pi =
                   local_70.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              local_58 = (element_type *)0x0;
              p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_70.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var5;
              if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
                 p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
              }
              pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                 (&local_70);
              __s._M_head_impl =
                   (pTVar9->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              lVar11 = local_48;
            }
            bVar4 = (byte)((ulong)uVar12 + lVar13) & 0x3f;
            __s._M_head_impl[(ulong)uVar12 + lVar13 >> 6] =
                 __s._M_head_impl[(ulong)uVar12 + lVar13 >> 6] &
                 (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          }
          lVar13 = lVar13 + 1;
        } while (uVar10 + (uVar10 == 0) != lVar13);
        uVar12 = pvVar6->count;
      }
      pvVar6->count = uVar12 + (short)uVar10;
      copy_count = local_40 - uVar10;
      if (copy_count != 0) {
        if ((pvVar6->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index
                    );
        }
        pvVar6 = vector<duckdb::VectorMetaData,_true>::operator[]
                           (&this->vector_data,prev_index.index);
        prev_index.index = (pvVar6->next_data).index;
      }
      if (local_70.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_c0 = local_c0 + uVar10;
    } while (copy_count != 0);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}